

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

ER __thiscall
slang::ast::ForeachLoopStatement::evalRecursive
          (ForeachLoopStatement *this,EvalContext *context,ConstantValue *cv,
          span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims)

{
  IteratorSymbol *symbol;
  ulong uVar1;
  ConstantValue *context_00;
  bool bVar2;
  int32_t iVar3;
  ConstantValue *pCVar4;
  Map *this_00;
  AssociativeArray *this_01;
  Queue *this_02;
  const_reference cv_00;
  ulong uVar5;
  ConstantRange *pCVar6;
  size_type sVar7;
  reference pCVar8;
  span<const_slang::ConstantValue,_18446744073709551615UL> sVar9;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_00;
  ConstantValue local_268;
  ConstantRange local_240;
  size_type local_238;
  size_t index;
  undefined1 local_228 [4];
  ER result_3;
  ConstantValue local_218;
  int32_t local_1f0;
  int32_t iStack_1ec;
  int32_t i_2;
  bool local_1e1;
  int32_t iStack_1e0;
  int32_t iStack_1dc;
  bool isLittleEndian;
  ConstantRange range;
  pointer local_1d0;
  undefined1 local_1c8 [8];
  span<const_slang::ConstantValue,_18446744073709551615UL> elements;
  undefined1 local_1b0 [4];
  ER result_2;
  ConstantValue local_1a0;
  ulong local_178;
  size_t i_1;
  string *str;
  ER local_154;
  undefined1 local_150 [4];
  ER result_1;
  ConstantValue local_140;
  ulong local_118;
  size_t i;
  SVQueue *q;
  ER local_f4;
  type *ptStack_f0;
  ER result;
  type *val;
  type *key;
  _Self local_d8;
  const_iterator __end3;
  const_iterator __begin3;
  AssociativeArray *__range3;
  AssociativeArray *map;
  ConstantValue *local_90;
  ConstantValue *local;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> local_78;
  ConstantValue local_68;
  reference local_40;
  LoopDim *dim;
  ConstantValue *cv_local;
  EvalContext *context_local;
  ForeachLoopStatement *this_local;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_local;
  
  currDims_local.data_ = (pointer)currDims.size_;
  this_local = (ForeachLoopStatement *)currDims.data_;
  dim = (LoopDim *)cv;
  cv_local = (ConstantValue *)context;
  context_local = (EvalContext *)this;
  local_40 = nonstd::span_lite::
             span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
             operator[]((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                         *)&this_local,0);
  pCVar4 = cv_local;
  if (local_40->loopVar == (IteratorSymbol *)0x0) {
    slang::ConstantValue::ConstantValue(&local_68,(nullptr_t)0x0);
    local_78 = nonstd::span_lite::
               span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
               subspan((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                        *)&this_local,1,0xffffffffffffffff);
    currDims_local.size_._4_4_ = evalRecursive(this,(EvalContext *)pCVar4,&local_68,local_78);
    slang::ConstantValue::~ConstantValue(&local_68);
  }
  else {
    symbol = local_40->loopVar;
    slang::ConstantValue::ConstantValue((ConstantValue *)&map,(nullptr_t)0x0);
    pCVar4 = EvalContext::createLocal
                       ((EvalContext *)pCVar4,(ValueSymbol *)symbol,(ConstantValue *)&map);
    slang::ConstantValue::~ConstantValue((ConstantValue *)&map);
    local_90 = pCVar4;
    bVar2 = slang::ConstantValue::isMap((ConstantValue *)dim);
    if (bVar2) {
      this_00 = slang::ConstantValue::map((ConstantValue *)dim);
      this_01 = CopyPtr<slang::AssociativeArray>::operator*(this_00);
      __end3 = std::
               map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               ::begin(&this_01->
                        super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                      );
      local_d8._M_node =
           (_Base_ptr)
           std::
           map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
           ::end(&this_01->
                  super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                );
      while (bVar2 = std::operator!=(&__end3,&local_d8), bVar2) {
        key = &std::
               _Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
               ::operator*(&__end3)->first;
        val = std::get<0ul,slang::ConstantValue_const,slang::ConstantValue>
                        ((pair<const_slang::ConstantValue,_slang::ConstantValue> *)key);
        ptStack_f0 = std::get<1ul,slang::ConstantValue_const,slang::ConstantValue>
                               ((pair<const_slang::ConstantValue,_slang::ConstantValue> *)key);
        slang::ConstantValue::operator=(local_90,val);
        sVar7 = nonstd::span_lite::
                span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::size
                          ((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                            *)&this_local);
        context_00 = cv_local;
        pCVar4 = ptStack_f0;
        if (sVar7 < 2) {
          local_f4 = Statement::eval(this->body,(EvalContext *)cv_local);
        }
        else {
          _q = nonstd::span_lite::
               span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
               subspan((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                        *)&this_local,1,0xffffffffffffffff);
          local_f4 = evalRecursive(this,(EvalContext *)context_00,pCVar4,_q);
        }
        if ((local_f4 != Success) && (local_f4 != Continue)) {
          return local_f4;
        }
        std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>::
        operator++(&__end3);
      }
    }
    else {
      bVar2 = slang::ConstantValue::isQueue((ConstantValue *)dim);
      if (bVar2) {
        this_02 = slang::ConstantValue::queue((ConstantValue *)dim);
        i = (size_t)CopyPtr<slang::SVQueue>::operator*(this_02);
        for (local_118 = 0; uVar1 = local_118,
            sVar7 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *
                               )i), uVar1 < sVar7; local_118 = local_118 + 1) {
          SVInt::SVInt((SVInt *)local_150,0x20,local_118,true);
          slang::ConstantValue::ConstantValue(&local_140,(SVInt *)local_150);
          slang::ConstantValue::operator=(local_90,&local_140);
          slang::ConstantValue::~ConstantValue(&local_140);
          SVInt::~SVInt((SVInt *)local_150);
          sVar7 = nonstd::span_lite::
                  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                  size((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                        *)&this_local);
          pCVar4 = cv_local;
          if (sVar7 < 2) {
            local_154 = Statement::eval(this->body,(EvalContext *)cv_local);
          }
          else {
            cv_00 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
                    operator[]((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *
                               )i,local_118);
            _str = nonstd::span_lite::
                   span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                   subspan((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                            *)&this_local,1,0xffffffffffffffff);
            local_154 = evalRecursive(this,(EvalContext *)pCVar4,cv_00,_str);
          }
          if ((local_154 != Success) && (local_154 != Continue)) {
            return local_154;
          }
        }
      }
      else {
        bVar2 = slang::ConstantValue::isString((ConstantValue *)dim);
        if (bVar2) {
          sVar7 = nonstd::span_lite::
                  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                  size((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                        *)&this_local);
          if (sVar7 != 1) {
            assert::assertFailed
                      ("currDims.size() == 1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                       ,0x76d,
                       "ER slang::ast::ForeachLoopStatement::evalRecursive(EvalContext &, const ConstantValue &, span<const LoopDim>) const"
                      );
          }
          i_1 = (size_t)slang::ConstantValue::str_abi_cxx11_((ConstantValue *)dim);
          for (local_178 = 0; uVar1 = local_178, uVar5 = std::__cxx11::string::size(), uVar1 < uVar5
              ; local_178 = local_178 + 1) {
            SVInt::SVInt((SVInt *)local_1b0,0x20,local_178,true);
            slang::ConstantValue::ConstantValue(&local_1a0,(SVInt *)local_1b0);
            slang::ConstantValue::operator=(local_90,&local_1a0);
            slang::ConstantValue::~ConstantValue(&local_1a0);
            SVInt::~SVInt((SVInt *)local_1b0);
            elements.size_._4_4_ = Statement::eval(this->body,(EvalContext *)cv_local);
            if ((elements.size_._4_4_ != Success) && (elements.size_._4_4_ != Continue)) {
              return elements.size_._4_4_;
            }
          }
        }
        else {
          nonstd::span_lite::span<const_slang::ConstantValue,_18446744073709551615UL>::span<true,_0>
                    ((span<const_slang::ConstantValue,_18446744073709551615UL> *)local_1c8);
          bVar2 = slang::ConstantValue::isUnpacked((ConstantValue *)dim);
          if (bVar2) {
            sVar9 = slang::ConstantValue::elements((ConstantValue *)dim);
            range = (ConstantRange)sVar9.data_;
            local_1c8._0_4_ = range.left;
            local_1c8._4_4_ = range.right;
            local_1d0 = (pointer)sVar9.size_;
            elements.data_ = local_1d0;
            _range = sVar9;
          }
          ConstantRange::ConstantRange((ConstantRange *)&stack0xfffffffffffffe20);
          bVar2 = std::optional::operator_cast_to_bool((optional *)local_40);
          if (bVar2) {
            pCVar6 = std::optional<slang::ConstantRange>::operator*(&local_40->range);
            _iStack_1e0 = *pCVar6;
            local_1e1 = ConstantRange::isLittleEndian((ConstantRange *)&stack0xfffffffffffffe20);
          }
          else {
            iStack_1ec = 0;
            sVar7 = nonstd::span_lite::span<const_slang::ConstantValue,_18446744073709551615UL>::
                    size((span<const_slang::ConstantValue,_18446744073709551615UL> *)local_1c8);
            i_2 = (int)sVar7 + -1;
            iStack_1dc = i_2;
            iStack_1e0 = iStack_1ec;
            local_1e1 = false;
          }
          local_1f0 = iStack_1e0;
          while( true ) {
            if ((local_1e1 & 1U) == 0) {
              bVar2 = local_1f0 <= iStack_1dc;
            }
            else {
              bVar2 = iStack_1dc <= local_1f0;
            }
            if (!bVar2) break;
            SVInt::SVInt((SVInt *)local_228,0x20,(long)local_1f0,true);
            slang::ConstantValue::ConstantValue(&local_218,(SVInt *)local_228);
            slang::ConstantValue::operator=(local_90,&local_218);
            slang::ConstantValue::~ConstantValue(&local_218);
            SVInt::~SVInt((SVInt *)local_228);
            sVar7 = nonstd::span_lite::
                    span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                    size((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                          *)&this_local);
            if (sVar7 < 2) {
              index._4_4_ = Statement::eval(this->body,(EvalContext *)cv_local);
            }
            else {
              local_238 = (size_type)local_1f0;
              bVar2 = std::optional::operator_cast_to_bool((optional *)local_40);
              if (bVar2) {
                local_240 = ConstantRange::reverse((ConstantRange *)&stack0xfffffffffffffe20);
                iVar3 = ConstantRange::translateIndex(&local_240,local_1f0);
                local_238 = (size_type)iVar3;
              }
              pCVar4 = cv_local;
              bVar2 = nonstd::span_lite::span<const_slang::ConstantValue,_18446744073709551615UL>::
                      empty((span<const_slang::ConstantValue,_18446744073709551615UL> *)local_1c8);
              if (bVar2) {
                slang::ConstantValue::ConstantValue(&local_268,(nullptr_t)0x0);
              }
              else {
                pCVar8 = nonstd::span_lite::span<const_slang::ConstantValue,_18446744073709551615UL>
                         ::operator[]((span<const_slang::ConstantValue,_18446744073709551615UL> *)
                                      local_1c8,local_238);
                slang::ConstantValue::ConstantValue(&local_268,pCVar8);
              }
              currDims_00 = nonstd::span_lite::
                            span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                            ::subspan((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                                       *)&this_local,1,0xffffffffffffffff);
              index._4_4_ = evalRecursive(this,(EvalContext *)pCVar4,&local_268,currDims_00);
              slang::ConstantValue::~ConstantValue(&local_268);
            }
            if ((index._4_4_ != Success) && (index._4_4_ != Continue)) {
              return index._4_4_;
            }
            if ((local_1e1 & 1U) == 0) {
              local_1f0 = local_1f0 + 1;
            }
            else {
              local_1f0 = local_1f0 + -1;
            }
          }
        }
      }
    }
    currDims_local.size_._4_4_ = Success;
  }
  return currDims_local.size_._4_4_;
}

Assistant:

ER ForeachLoopStatement::evalRecursive(EvalContext& context, const ConstantValue& cv,
                                       span<const LoopDim> currDims) const {
    // If there is no loop var just skip this index.
    auto& dim = currDims[0];
    if (!dim.loopVar) {
        // Shouldn't ever be at the end here.
        return evalRecursive(context, nullptr, currDims.subspan(1));
    }

    auto local = context.createLocal(dim.loopVar);

    // If this is an associative array, looping happens over the keys.
    if (cv.isMap()) {
        auto& map = *cv.map();
        for (auto& [key, val] : map) {
            *local = key;

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, val, currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isQueue()) {
        auto& q = *cv.queue();
        for (size_t i = 0; i < q.size(); i++) {
            *local = SVInt(32, i, true);

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, q[i], currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isString()) {
        ASSERT(currDims.size() == 1);

        auto& str = cv.str();
        for (size_t i = 0; i < str.size(); i++) {
            *local = SVInt(32, i, true);

            ER result = body.eval(context);
            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else {
        span<const ConstantValue> elements;
        if (cv.isUnpacked())
            elements = cv.elements();

        ConstantRange range;
        bool isLittleEndian;
        if (dim.range) {
            range = *dim.range;
            isLittleEndian = range.isLittleEndian();
        }
        else {
            range = {0, int32_t(elements.size()) - 1};
            isLittleEndian = false;
        }

        for (int32_t i = range.left; isLittleEndian ? i >= range.right : i <= range.right;
             isLittleEndian ? i-- : i++) {

            *local = SVInt(32, uint64_t(i), true);

            ER result;
            if (currDims.size() > 1) {
                size_t index = size_t(i);
                if (dim.range)
                    index = (size_t)range.reverse().translateIndex(i);

                result = evalRecursive(context, elements.empty() ? nullptr : elements[index],
                                       currDims.subspan(1));
            }
            else {
                result = body.eval(context);
            }

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}